

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::trim(string *__return_storage_ptr__,string *str)

{
  allocator local_29;
  undefined8 local_28;
  size_type end;
  size_type start;
  string *str_local;
  
  start = (size_type)str;
  str_local = __return_storage_ptr__;
  end = std::__cxx11::string::find_first_not_of((char *)str,(ulong)trim::whitespaceChars);
  local_28 = std::__cxx11::string::find_last_not_of((char *)start,(ulong)trim::whitespaceChars);
  if (end == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim( std::string const& str ) {
        static char const* whitespaceChars = "\n\r\t ";
        std::string::size_type start = str.find_first_not_of( whitespaceChars );
        std::string::size_type end = str.find_last_not_of( whitespaceChars );

        return start != std::string::npos ? str.substr( start, 1+end-start ) : "";
    }